

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ZSTD_matchState_t *pZVar9;
  BYTE *pBVar10;
  ulong *mEnd;
  BYTE *pBVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  seqDef *psVar14;
  bool bVar15;
  undefined8 uVar16;
  char cVar17;
  uint uVar18;
  ulong *puVar19;
  size_t sVar20;
  ulong *puVar21;
  byte bVar22;
  byte bVar23;
  BYTE *iStart;
  uint uVar24;
  long lVar25;
  BYTE *litEnd_1;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong *iEnd;
  BYTE *unaff_RBP;
  uint uVar31;
  uint uVar32;
  ulong *puVar33;
  int *piVar34;
  ulong uVar35;
  ulong *puVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  BYTE *pBVar44;
  int iVar45;
  char *_ptr;
  BYTE *pBVar46;
  ulong uVar47;
  U32 UVar48;
  BYTE *litEnd;
  bool bVar49;
  U32 prefixStartIndex;
  BYTE *iend;
  BYTE *base;
  U32 dictIndexDelta;
  BYTE *prefixStart;
  U32 *hashTable;
  BYTE *litLimit_w;
  BYTE *ilimit;
  BYTE *litLimit_w_4;
  BYTE *dictEnd;
  BYTE *dictBase;
  U32 dictHBits;
  U32 stepSize;
  BYTE *dictStart;
  U32 dictStartIndex;
  uint local_178;
  uint local_174;
  uint local_14c;
  ulong local_c0;
  ulong *local_b8;
  ulong *local_b0;
  ulong local_a8;
  
  pZVar9 = ms->dictMatchState;
  if (pZVar9 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x724e,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar5 = (ms->cParams).targetLength;
  uVar26 = (ulong)(uVar5 + (uVar5 == 0));
  pBVar10 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar10 + uVar6;
  iEnd = (ulong *)((long)src + srcSize);
  puVar33 = (ulong *)((long)src + (srcSize - 8));
  uVar7 = (pZVar9->window).dictLimit;
  mEnd = (ulong *)(pZVar9->window).nextSrc;
  pBVar11 = (pZVar9->window).base;
  pBVar46 = pBVar11 + uVar7;
  uVar31 = (int)mEnd - (int)pBVar11;
  uVar38 = uVar6 - uVar31;
  iVar42 = ((int)src - (int)iStart) + (int)mEnd;
  iVar45 = (int)pBVar46;
  uVar43 = iVar42 - iVar45;
  uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar12 = pZVar9->hashTable;
  uVar18 = (pZVar9->cParams).hashLog;
  iVar40 = (int)pBVar10;
  uVar39 = ((int)iEnd - iVar40) - uVar6;
  uVar24 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  uVar8 = (ms->cParams).hashLog;
  puVar21 = (ulong *)((long)src + uVar26);
  uVar32 = *rep;
  local_178 = rep[1];
  uVar5 = uVar18 + 8;
  bVar22 = (byte)uVar18;
  cVar17 = (char)uVar8;
  puVar30 = (ulong *)src;
  if (uVar24 == 5) {
    if (uVar37 < uVar39) goto LAB_00171987;
    if (uVar6 < uVar31) goto LAB_001719a6;
    if ((ms->prefetchCDictTables != 0) && (uVar18 < 0x3e)) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    if (uVar43 < uVar32) goto LAB_001719c5;
    if (uVar43 < local_178) goto LAB_001719e4;
    puVar27 = (ulong *)((long)src + (ulong)(iVar42 == iVar45));
    bVar23 = 0x40 - cVar17;
    puVar1 = iEnd + -4;
    do {
      if (puVar33 < puVar21) goto LAB_0017178d;
      if ((0x20 < uVar8) || (0x20 < uVar5)) goto LAB_001718cd;
      local_a8 = *puVar27 * -0x30e4432345000000 >> (bVar23 & 0x3f);
      uVar35 = *puVar27 * -0x30e4432345000000 >> (0x38 - bVar22 & 0x3f);
      local_14c = pUVar12[uVar35 >> 8];
      bVar49 = (char)local_14c == (char)uVar35;
      local_174 = pUVar13[local_a8];
      UVar48 = (int)puVar27 - iVar40;
      local_b0 = puVar27 + 0x20;
      puVar2 = puVar30 + 2;
      puVar19 = puVar21;
      local_b8 = (ulong *)uVar26;
      do {
        uVar18 = (UVar48 - uVar32) + 1;
        piVar34 = (int *)(pBVar10 + uVar18);
        if (uVar18 < uVar6) {
          piVar34 = (int *)(pBVar11 + (uVar18 - uVar38));
        }
        uVar47 = *puVar19 * -0x30e4432345000000 >> (bVar23 & 0x3f);
        uVar35 = *puVar19 * -0x30e4432345000000 >> (0x38 - bVar22 & 0x3f);
        pUVar13[local_a8] = UVar48;
        puVar21 = puVar19;
        if (((uVar6 - 1) - uVar18 < 3) || (*piVar34 != *(int *)((long)puVar27 + 1))) {
          if (bVar49) {
            uVar18 = local_14c >> 8;
            iVar42 = 0;
            bVar15 = true;
            if (((uVar7 < uVar18) && (*(int *)(pBVar11 + uVar18) == (int)*puVar27)) &&
               (local_174 <= uVar6)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar11 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_RBP = (BYTE *)(sVar20 + 4);
              if (puVar30 < puVar27) {
                pBVar44 = pBVar11 + ((ulong)uVar18 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar27 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar27 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = pBVar46 < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar18 = UVar48 - (uVar18 + uVar38);
              if (uVar18 == 0) goto LAB_001718ec;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              uVar29 = (long)puVar27 - (long)puVar30;
              puVar28 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar28 + uVar29))
              goto LAB_00171813;
              if (iEnd < puVar27) goto LAB_00171832;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar28,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar41 = puVar30[1];
                *puVar28 = *puVar30;
                puVar28[1] = uVar41;
                if (0x10 < uVar29) {
                  pBVar44 = seqStore->lit;
                  if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                  goto LAB_001718ae;
                  uVar41 = puVar30[3];
                  *(ulong *)(pBVar44 + 0x10) = *puVar2;
                  *(ulong *)(pBVar44 + 0x18) = uVar41;
                  if (0x20 < (long)uVar29) {
                    lVar25 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                      uVar16 = puVar4[1];
                      pBVar3 = pBVar44 + lVar25 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar16;
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                      uVar16 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                      lVar25 = lVar25 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar44 + uVar29);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar29;
              psVar14->offBase = uVar18 + 3;
              if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
              if ((BYTE *)0xffff < unaff_RBP + -3) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(unaff_RBP + -3);
              seqStore->sequences = psVar14 + 1;
              iVar42 = 8;
              bVar15 = false;
              local_178 = uVar32;
              uVar32 = uVar18;
            }
            if (!bVar15) goto LAB_001708a7;
          }
          if (uVar6 < local_174) {
            piVar34 = (int *)(pBVar10 + local_174);
            if (*piVar34 == (int)*puVar27) {
              puVar19 = (ulong *)((long)puVar27 + 4);
              puVar36 = (ulong *)(piVar34 + 1);
              puVar28 = puVar19;
              if (puVar19 < (ulong *)((long)iEnd - 7U)) {
                uVar47 = *puVar19 ^ *puVar36;
                uVar35 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar44 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                if (*puVar36 == *puVar19) {
                  puVar28 = (ulong *)((long)puVar27 + 0xc);
                  puVar36 = (ulong *)(piVar34 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar28) goto LAB_00170675;
                    uVar35 = *puVar36;
                    uVar47 = *puVar28;
                    uVar41 = uVar47 ^ uVar35;
                    uVar29 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    pBVar44 = (BYTE *)((long)puVar28 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                    puVar28 = puVar28 + 1;
                    puVar36 = puVar36 + 1;
                  } while (uVar35 == uVar47);
                }
              }
              else {
LAB_00170675:
                if ((puVar28 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar36 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar28 < (ulong *)((long)iEnd + -1)) && ((short)*puVar36 == (short)*puVar28))
                {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar28 < iEnd) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                }
                pBVar44 = (BYTE *)((long)puVar28 - (long)puVar19);
              }
              unaff_RBP = pBVar44 + 4;
              puVar19 = puVar27;
              if (puVar30 < puVar27) {
                pBVar44 = pBVar10 + ((ulong)local_174 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar19 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar19 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = iStart < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar18 = (int)puVar27 - (int)piVar34;
              if (uVar18 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar35 = (long)puVar19 - (long)puVar30;
                    puVar27 = (ulong *)seqStore->lit;
                    if ((BYTE *)((long)puVar27 + uVar35) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (puVar19 <= iEnd) {
                        if (puVar1 < puVar19) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)puVar27,(BYTE *)puVar30,(BYTE *)puVar19,(BYTE *)puVar1)
                          ;
                        }
                        else {
                          uVar47 = puVar30[1];
                          *puVar27 = *puVar30;
                          puVar27[1] = uVar47;
                          if (0x10 < uVar35) {
                            pBVar44 = seqStore->lit;
                            if (0xffffffffffffffe0 <
                                (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                            goto LAB_001718ae;
                            uVar47 = puVar30[3];
                            *(ulong *)(pBVar44 + 0x10) = *puVar2;
                            *(ulong *)(pBVar44 + 0x18) = uVar47;
                            if (0x20 < (long)uVar35) {
                              lVar25 = 0;
                              do {
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                                uVar16 = puVar4[1];
                                pBVar3 = pBVar44 + lVar25 + 0x20;
                                *(undefined8 *)pBVar3 = *puVar4;
                                *(undefined8 *)(pBVar3 + 8) = uVar16;
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                                uVar16 = puVar4[1];
                                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                                *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                                lVar25 = lVar25 + 0x20;
                              } while (pBVar3 + 0x20 < pBVar44 + uVar35);
                            }
                          }
                        }
                        seqStore->lit = seqStore->lit + uVar35;
                        if (0xffff < uVar35) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14 = seqStore->sequences;
                        psVar14->litLength = (U16)uVar35;
                        psVar14->offBase = uVar18 + 3;
                        if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
                        if ((BYTE *)0xffff < unaff_RBP + -3) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                          seqStore->longLengthType = ZSTD_llt_matchLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14->mlBase = (U16)(unaff_RBP + -3);
                        seqStore->sequences = psVar14 + 1;
                        iVar42 = 8;
                        puVar27 = puVar19;
                        local_178 = uVar32;
                        uVar32 = uVar18;
                        goto LAB_001708a7;
                      }
                      goto LAB_00171832;
                    }
                    goto LAB_00171813;
                  }
                  goto LAB_001717d5;
                }
                goto LAB_001717b6;
              }
              goto LAB_0017188f;
            }
          }
          local_14c = pUVar12[uVar35 >> 8];
          bVar49 = (char)uVar35 == (char)local_14c;
          local_174 = pUVar13[uVar47];
          local_b8 = (ulong *)((long)local_b8 + (ulong)(local_b0 <= puVar19));
          local_b0 = local_b0 + (ulong)(local_b0 <= puVar19) * 0x20;
          puVar21 = (ulong *)((long)puVar19 + (long)local_b8);
          iVar42 = 0xd;
          puVar27 = puVar19;
          if (puVar21 <= puVar33) {
            UVar48 = (int)puVar19 - iVar40;
            iVar42 = 0;
            local_a8 = uVar47;
          }
        }
        else {
          puVar19 = iEnd;
          if (uVar18 < uVar6) {
            puVar19 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar19,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001717b6;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
          puVar27 = (ulong *)((long)puVar27 + 1);
          uVar35 = (long)puVar27 - (long)puVar30;
          puVar19 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar35))
          goto LAB_00171813;
          if (iEnd < puVar27) goto LAB_00171832;
          if (puVar1 < puVar27) {
            ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
          }
          else {
            uVar47 = puVar30[1];
            *puVar19 = *puVar30;
            puVar19[1] = uVar47;
            if (0x10 < uVar35) {
              pBVar44 = seqStore->lit;
              if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
              goto LAB_001718ae;
              uVar47 = puVar30[3];
              *(ulong *)(pBVar44 + 0x10) = *puVar2;
              *(ulong *)(pBVar44 + 0x18) = uVar47;
              if (0x20 < (long)uVar35) {
                lVar25 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                  uVar16 = puVar4[1];
                  pBVar3 = pBVar44 + lVar25 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar16;
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                  uVar16 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                  lVar25 = lVar25 + 0x20;
                } while (pBVar3 + 0x20 < pBVar44 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar20 + 4);
          psVar14 = seqStore->sequences;
          psVar14->litLength = (U16)uVar35;
          psVar14->offBase = 1;
          if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->mlBase = (U16)(sVar20 + 1);
          seqStore->sequences = psVar14 + 1;
          iVar42 = 8;
        }
LAB_001708a7:
        puVar19 = puVar21;
      } while (iVar42 == 0);
      if (iVar42 == 8) {
        if (unaff_RBP == (BYTE *)0x0) goto LAB_0017190b;
        puVar30 = (ulong *)((long)puVar27 + (long)unaff_RBP);
        puVar27 = puVar30;
        if (puVar30 <= puVar33) {
          if (pBVar10 + (ulong)UVar48 + 2 <= src) goto LAB_00171949;
          pUVar13[(ulong)(*(long *)(pBVar10 + (ulong)UVar48 + 2) * -0x30e4432345000000) >>
                  (bVar23 & 0x3f)] = UVar48 + 2;
          pUVar13[(ulong)(*(long *)((long)puVar30 + -2) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
               ((int)puVar30 + -2) - iVar40;
          do {
            if (puVar33 < puVar27) break;
            UVar48 = (int)puVar27 - iVar40;
            uVar18 = UVar48 - local_178;
            pBVar44 = pBVar10;
            if (uVar18 < uVar6) {
              pBVar44 = pBVar11 + -(ulong)uVar38;
            }
            if (((uVar6 - 1) - uVar18 < 3) || (*(int *)(pBVar44 + uVar18) != (int)*puVar27)) {
              bVar49 = false;
              uVar18 = local_178;
            }
            else {
              puVar21 = iEnd;
              if (uVar18 < uVar6) {
                puVar21 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar44 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar21,iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              puVar21 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_00171813;
              if (iEnd < puVar30) goto LAB_00171832;
              if (puVar1 < puVar30) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar21,(BYTE *)puVar30,(BYTE *)puVar30,(BYTE *)puVar1);
              }
              else {
                uVar35 = puVar30[1];
                *puVar21 = *puVar30;
                puVar21[1] = uVar35;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_001717f4;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar14 + 1;
              pUVar13[*puVar27 * -0x30e4432345000000 >> (bVar23 & 0x3f)] = UVar48;
              puVar30 = (ulong *)(sVar20 + 4 + (long)puVar27);
              bVar49 = true;
              puVar27 = puVar30;
              uVar18 = uVar32;
              uVar32 = local_178;
            }
            local_178 = uVar18;
          } while (bVar49);
        }
        if (puVar27 != puVar30) goto LAB_0017192a;
        puVar21 = (ulong *)(uVar26 + (long)puVar27);
        iVar42 = 0;
      }
    } while (iVar42 == 0);
  }
  else if (uVar24 == 6) {
    if (uVar37 < uVar39) goto LAB_00171987;
    if (uVar6 < uVar31) goto LAB_001719a6;
    if ((ms->prefetchCDictTables != 0) && (uVar18 < 0x3e)) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    if (uVar43 < uVar32) goto LAB_001719c5;
    if (uVar43 < local_178) goto LAB_001719e4;
    puVar27 = (ulong *)((long)src + (ulong)(iVar42 == iVar45));
    bVar23 = 0x40 - cVar17;
    puVar1 = iEnd + -4;
    do {
      if (puVar33 < puVar21) goto LAB_0017178d;
      if ((0x20 < uVar8) || (0x20 < uVar5)) goto LAB_001718cd;
      local_a8 = *puVar27 * -0x30e4432340650000 >> (bVar23 & 0x3f);
      uVar35 = *puVar27 * -0x30e4432340650000 >> (0x38 - bVar22 & 0x3f);
      uVar18 = pUVar12[uVar35 >> 8];
      bVar49 = (char)uVar18 == (char)uVar35;
      local_174 = pUVar13[local_a8];
      UVar48 = (int)puVar27 - iVar40;
      local_b8 = puVar27 + 0x20;
      puVar2 = puVar30 + 2;
      puVar19 = puVar21;
      local_c0 = uVar26;
      do {
        uVar24 = (UVar48 - uVar32) + 1;
        piVar34 = (int *)(pBVar10 + uVar24);
        if (uVar24 < uVar6) {
          piVar34 = (int *)(pBVar11 + (uVar24 - uVar38));
        }
        uVar47 = *puVar19 * -0x30e4432340650000 >> (bVar23 & 0x3f);
        uVar35 = *puVar19 * -0x30e4432340650000 >> (0x38 - bVar22 & 0x3f);
        pUVar13[local_a8] = UVar48;
        puVar21 = puVar19;
        if (((uVar6 - 1) - uVar24 < 3) || (*piVar34 != *(int *)((long)puVar27 + 1))) {
          if (bVar49) {
            uVar24 = uVar18 >> 8;
            iVar42 = 0;
            bVar15 = true;
            if (((uVar7 < uVar24) && (*(int *)(pBVar11 + uVar24) == (int)*puVar27)) &&
               (local_174 <= uVar6)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar11 + uVar24) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_RBP = (BYTE *)(sVar20 + 4);
              if (puVar30 < puVar27) {
                pBVar44 = pBVar11 + ((ulong)uVar24 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar27 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar27 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = pBVar46 < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar24 = UVar48 - (uVar24 + uVar38);
              if (uVar24 == 0) goto LAB_001718ec;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              uVar29 = (long)puVar27 - (long)puVar30;
              puVar28 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar28 + uVar29))
              goto LAB_00171813;
              if (iEnd < puVar27) goto LAB_00171832;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar28,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar41 = puVar30[1];
                *puVar28 = *puVar30;
                puVar28[1] = uVar41;
                if (0x10 < uVar29) {
                  pBVar44 = seqStore->lit;
                  if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                  goto LAB_001718ae;
                  uVar41 = puVar30[3];
                  *(ulong *)(pBVar44 + 0x10) = *puVar2;
                  *(ulong *)(pBVar44 + 0x18) = uVar41;
                  if (0x20 < (long)uVar29) {
                    lVar25 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                      uVar16 = puVar4[1];
                      pBVar3 = pBVar44 + lVar25 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar16;
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                      uVar16 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                      lVar25 = lVar25 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar44 + uVar29);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar29;
              psVar14->offBase = uVar24 + 3;
              if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
              if ((BYTE *)0xffff < unaff_RBP + -3) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(unaff_RBP + -3);
              seqStore->sequences = psVar14 + 1;
              iVar42 = 8;
              bVar15 = false;
              local_178 = uVar32;
              uVar32 = uVar24;
            }
            if (!bVar15) goto LAB_0016fbe8;
          }
          if (uVar6 < local_174) {
            piVar34 = (int *)(pBVar10 + local_174);
            if (*piVar34 == (int)*puVar27) {
              puVar19 = (ulong *)((long)puVar27 + 4);
              puVar36 = (ulong *)(piVar34 + 1);
              puVar28 = puVar19;
              if (puVar19 < (ulong *)((long)iEnd - 7U)) {
                uVar47 = *puVar19 ^ *puVar36;
                uVar35 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar44 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                if (*puVar36 == *puVar19) {
                  puVar28 = (ulong *)((long)puVar27 + 0xc);
                  puVar36 = (ulong *)(piVar34 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar28) goto LAB_0016f9b7;
                    uVar35 = *puVar36;
                    uVar47 = *puVar28;
                    uVar41 = uVar47 ^ uVar35;
                    uVar29 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    pBVar44 = (BYTE *)((long)puVar28 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                    puVar28 = puVar28 + 1;
                    puVar36 = puVar36 + 1;
                  } while (uVar35 == uVar47);
                }
              }
              else {
LAB_0016f9b7:
                if ((puVar28 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar36 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar28 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar36 == (short)*puVar28))
                {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar28 < iEnd) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                }
                pBVar44 = (BYTE *)((long)puVar28 - (long)puVar19);
              }
              unaff_RBP = pBVar44 + 4;
              puVar19 = puVar27;
              if (puVar30 < puVar27) {
                pBVar44 = pBVar10 + ((ulong)local_174 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar19 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar19 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = iStart < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar24 = (int)puVar27 - (int)piVar34;
              if (uVar24 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar35 = (long)puVar19 - (long)puVar30;
                    puVar27 = (ulong *)seqStore->lit;
                    if ((BYTE *)((long)puVar27 + uVar35) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (puVar19 <= iEnd) {
                        if (puVar1 < puVar19) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)puVar27,(BYTE *)puVar30,(BYTE *)puVar19,(BYTE *)puVar1)
                          ;
                        }
                        else {
                          uVar47 = puVar30[1];
                          *puVar27 = *puVar30;
                          puVar27[1] = uVar47;
                          if (0x10 < uVar35) {
                            pBVar44 = seqStore->lit;
                            if (0xffffffffffffffe0 <
                                (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                            goto LAB_001718ae;
                            uVar47 = puVar30[3];
                            *(ulong *)(pBVar44 + 0x10) = *puVar2;
                            *(ulong *)(pBVar44 + 0x18) = uVar47;
                            if (0x20 < (long)uVar35) {
                              lVar25 = 0;
                              do {
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                                uVar16 = puVar4[1];
                                pBVar3 = pBVar44 + lVar25 + 0x20;
                                *(undefined8 *)pBVar3 = *puVar4;
                                *(undefined8 *)(pBVar3 + 8) = uVar16;
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                                uVar16 = puVar4[1];
                                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                                *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                                lVar25 = lVar25 + 0x20;
                              } while (pBVar3 + 0x20 < pBVar44 + uVar35);
                            }
                          }
                        }
                        seqStore->lit = seqStore->lit + uVar35;
                        if (0xffff < uVar35) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14 = seqStore->sequences;
                        psVar14->litLength = (U16)uVar35;
                        psVar14->offBase = uVar24 + 3;
                        if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
                        if ((BYTE *)0xffff < unaff_RBP + -3) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                          seqStore->longLengthType = ZSTD_llt_matchLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14->mlBase = (U16)(unaff_RBP + -3);
                        seqStore->sequences = psVar14 + 1;
                        iVar42 = 8;
                        puVar27 = puVar19;
                        local_178 = uVar32;
                        uVar32 = uVar24;
                        goto LAB_0016fbe8;
                      }
                      goto LAB_00171832;
                    }
                    goto LAB_00171813;
                  }
                  goto LAB_001717d5;
                }
                goto LAB_001717b6;
              }
              goto LAB_0017188f;
            }
          }
          uVar18 = pUVar12[uVar35 >> 8];
          bVar49 = (char)uVar35 == (char)uVar18;
          local_174 = pUVar13[uVar47];
          local_c0 = local_c0 + (local_b8 <= puVar19);
          local_b8 = local_b8 + (ulong)(local_b8 <= puVar19) * 0x20;
          puVar21 = (ulong *)((long)puVar19 + local_c0);
          iVar42 = 0xd;
          puVar27 = puVar19;
          if (puVar21 <= puVar33) {
            UVar48 = (int)puVar19 - iVar40;
            iVar42 = 0;
            local_a8 = uVar47;
          }
        }
        else {
          puVar19 = iEnd;
          if (uVar24 < uVar6) {
            puVar19 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar19,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001717b6;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
          puVar27 = (ulong *)((long)puVar27 + 1);
          uVar35 = (long)puVar27 - (long)puVar30;
          puVar19 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar35))
          goto LAB_00171813;
          if (iEnd < puVar27) goto LAB_00171832;
          if (puVar1 < puVar27) {
            ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
          }
          else {
            uVar47 = puVar30[1];
            *puVar19 = *puVar30;
            puVar19[1] = uVar47;
            if (0x10 < uVar35) {
              pBVar44 = seqStore->lit;
              if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
              goto LAB_001718ae;
              uVar47 = puVar30[3];
              *(ulong *)(pBVar44 + 0x10) = *puVar2;
              *(ulong *)(pBVar44 + 0x18) = uVar47;
              if (0x20 < (long)uVar35) {
                lVar25 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                  uVar16 = puVar4[1];
                  pBVar3 = pBVar44 + lVar25 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar16;
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                  uVar16 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                  lVar25 = lVar25 + 0x20;
                } while (pBVar3 + 0x20 < pBVar44 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar20 + 4);
          psVar14 = seqStore->sequences;
          psVar14->litLength = (U16)uVar35;
          psVar14->offBase = 1;
          if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->mlBase = (U16)(sVar20 + 1);
          seqStore->sequences = psVar14 + 1;
          iVar42 = 8;
        }
LAB_0016fbe8:
        puVar19 = puVar21;
      } while (iVar42 == 0);
      if (iVar42 == 8) {
        if (unaff_RBP == (BYTE *)0x0) goto LAB_0017190b;
        puVar27 = (ulong *)((long)puVar27 + (long)unaff_RBP);
        puVar30 = puVar27;
        if (puVar27 <= puVar33) {
          if (pBVar10 + (ulong)UVar48 + 2 <= src) goto LAB_00171949;
          pUVar13[(ulong)(*(long *)(pBVar10 + (ulong)UVar48 + 2) * -0x30e4432340650000) >>
                  (bVar23 & 0x3f)] = UVar48 + 2;
          pUVar13[(ulong)(*(long *)((long)puVar27 + -2) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
               ((int)puVar27 + -2) - iVar40;
          do {
            if (puVar33 < puVar27) break;
            UVar48 = (int)puVar27 - iVar40;
            uVar18 = UVar48 - local_178;
            pBVar44 = pBVar10;
            if (uVar18 < uVar6) {
              pBVar44 = pBVar11 + -(ulong)uVar38;
            }
            if (((uVar6 - 1) - uVar18 < 3) || (*(int *)(pBVar44 + uVar18) != (int)*puVar27)) {
              bVar49 = false;
              uVar18 = local_178;
            }
            else {
              puVar21 = iEnd;
              if (uVar18 < uVar6) {
                puVar21 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar44 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar21,iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              puVar21 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_00171813;
              if (iEnd < puVar30) goto LAB_00171832;
              if (puVar1 < puVar30) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar21,(BYTE *)puVar30,(BYTE *)puVar30,(BYTE *)puVar1);
              }
              else {
                uVar35 = puVar30[1];
                *puVar21 = *puVar30;
                puVar21[1] = uVar35;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_001717f4;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar14 + 1;
              pUVar13[*puVar27 * -0x30e4432340650000 >> (bVar23 & 0x3f)] = UVar48;
              puVar27 = (ulong *)(sVar20 + 4 + (long)puVar27);
              bVar49 = true;
              puVar30 = puVar27;
              uVar18 = uVar32;
              uVar32 = local_178;
            }
            local_178 = uVar18;
          } while (bVar49);
        }
        if (puVar27 != puVar30) goto LAB_0017192a;
        puVar21 = (ulong *)(uVar26 + (long)puVar27);
        iVar42 = 0;
      }
    } while (iVar42 == 0);
  }
  else if (uVar24 == 7) {
    if (uVar37 < uVar39) {
LAB_00171987:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a0,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar6 < uVar31) {
LAB_001719a6:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a7,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if ((ms->prefetchCDictTables != 0) && (uVar18 < 0x3e)) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    if (uVar43 < uVar32) {
LAB_001719c5:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71b3,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar43 < local_178) {
LAB_001719e4:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71b4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    puVar27 = (ulong *)((long)src + (ulong)(iVar42 == iVar45));
    bVar23 = 0x40 - cVar17;
    puVar1 = iEnd + -4;
    do {
      if (puVar33 < puVar21) goto LAB_0017178d;
      if ((0x20 < uVar8) || (0x20 < uVar5)) {
LAB_001718cd:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      local_a8 = *puVar27 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
      uVar35 = *puVar27 * -0x30e44323405a9d00 >> (0x38 - bVar22 & 0x3f);
      uVar18 = pUVar12[uVar35 >> 8];
      bVar49 = (char)uVar18 == (char)uVar35;
      local_174 = pUVar13[local_a8];
      UVar48 = (int)puVar27 - iVar40;
      local_b8 = puVar27 + 0x20;
      puVar2 = puVar30 + 2;
      puVar19 = puVar21;
      local_c0 = uVar26;
      do {
        uVar24 = (UVar48 - uVar32) + 1;
        piVar34 = (int *)(pBVar10 + uVar24);
        if (uVar24 < uVar6) {
          piVar34 = (int *)(pBVar11 + (uVar24 - uVar38));
        }
        uVar47 = *puVar19 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
        uVar35 = *puVar19 * -0x30e44323405a9d00 >> (0x38 - bVar22 & 0x3f);
        pUVar13[local_a8] = UVar48;
        puVar21 = puVar19;
        if (((uVar6 - 1) - uVar24 < 3) || (*piVar34 != *(int *)((long)puVar27 + 1))) {
          if (bVar49) {
            uVar24 = uVar18 >> 8;
            iVar42 = 0;
            bVar15 = true;
            if (((uVar7 < uVar24) && (*(int *)(pBVar11 + uVar24) == (int)*puVar27)) &&
               (local_174 <= uVar6)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar11 + uVar24) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_RBP = (BYTE *)(sVar20 + 4);
              if (puVar30 < puVar27) {
                pBVar44 = pBVar11 + ((ulong)uVar24 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar27 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar27 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = pBVar46 < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar24 = UVar48 - (uVar24 + uVar38);
              if (uVar24 == 0) {
LAB_001718ec:
                __assert_fail("(offset)>0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x71ed,
                              "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                             );
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              uVar29 = (long)puVar27 - (long)puVar30;
              puVar28 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar28 + uVar29))
              goto LAB_00171813;
              if (iEnd < puVar27) goto LAB_00171832;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar28,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar41 = puVar30[1];
                *puVar28 = *puVar30;
                puVar28[1] = uVar41;
                if (0x10 < uVar29) {
                  pBVar44 = seqStore->lit;
                  if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                  {
LAB_001718ae:
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar41 = puVar30[3];
                  *(ulong *)(pBVar44 + 0x10) = *puVar2;
                  *(ulong *)(pBVar44 + 0x18) = uVar41;
                  if (0x20 < (long)uVar29) {
                    lVar25 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                      uVar16 = puVar4[1];
                      pBVar3 = pBVar44 + lVar25 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar16;
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                      uVar16 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                      lVar25 = lVar25 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar44 + uVar29);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar29;
              if (0xffff < uVar29) {
                if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00171870:
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46a0,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar29;
              psVar14->offBase = uVar24 + 3;
              if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
              if ((BYTE *)0xffff < unaff_RBP + -3) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(unaff_RBP + -3);
              seqStore->sequences = psVar14 + 1;
              iVar42 = 8;
              bVar15 = false;
              local_178 = uVar32;
              uVar32 = uVar24;
            }
            if (!bVar15) goto LAB_0016ef3d;
          }
          if (uVar6 < local_174) {
            piVar34 = (int *)(pBVar10 + local_174);
            if (*piVar34 == (int)*puVar27) {
              puVar19 = (ulong *)((long)puVar27 + 4);
              puVar36 = (ulong *)(piVar34 + 1);
              puVar28 = puVar19;
              if (puVar19 < (ulong *)((long)iEnd - 7U)) {
                uVar47 = *puVar19 ^ *puVar36;
                uVar35 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar44 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                if (*puVar36 == *puVar19) {
                  puVar28 = (ulong *)((long)puVar27 + 0xc);
                  puVar36 = (ulong *)(piVar34 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar28) goto LAB_0016ed0b;
                    uVar35 = *puVar36;
                    uVar47 = *puVar28;
                    uVar41 = uVar47 ^ uVar35;
                    uVar29 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    pBVar44 = (BYTE *)((long)puVar28 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                    puVar28 = puVar28 + 1;
                    puVar36 = puVar36 + 1;
                  } while (uVar35 == uVar47);
                }
              }
              else {
LAB_0016ed0b:
                if ((puVar28 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar36 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar28 < (ulong *)((long)iEnd + -1)) && ((short)*puVar36 == (short)*puVar28))
                {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar28 < iEnd) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                }
                pBVar44 = (BYTE *)((long)puVar28 - (long)puVar19);
              }
              unaff_RBP = pBVar44 + 4;
              puVar19 = puVar27;
              if (puVar30 < puVar27) {
                pBVar44 = pBVar10 + ((ulong)local_174 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar19 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar19 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = iStart < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar24 = (int)puVar27 - (int)piVar34;
              if (uVar24 == 0) {
LAB_0017188f:
                __assert_fail("(offset)>0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x71ff,
                              "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                             );
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar35 = (long)puVar19 - (long)puVar30;
                  puVar27 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar27 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar19 <= iEnd) {
                      if (puVar1 < puVar19) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar27,(BYTE *)puVar30,(BYTE *)puVar19,(BYTE *)puVar1);
                      }
                      else {
                        uVar47 = puVar30[1];
                        *puVar27 = *puVar30;
                        puVar27[1] = uVar47;
                        if (0x10 < uVar35) {
                          pBVar44 = seqStore->lit;
                          if (0xffffffffffffffe0 <
                              (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                          goto LAB_001718ae;
                          uVar47 = puVar30[3];
                          *(ulong *)(pBVar44 + 0x10) = *puVar2;
                          *(ulong *)(pBVar44 + 0x18) = uVar47;
                          if (0x20 < (long)uVar35) {
                            lVar25 = 0;
                            do {
                              puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                              uVar16 = puVar4[1];
                              pBVar3 = pBVar44 + lVar25 + 0x20;
                              *(undefined8 *)pBVar3 = *puVar4;
                              *(undefined8 *)(pBVar3 + 8) = uVar16;
                              puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                              uVar16 = puVar4[1];
                              *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                              *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                              lVar25 = lVar25 + 0x20;
                            } while (pBVar3 + 0x20 < pBVar44 + uVar35);
                          }
                        }
                      }
                      seqStore->lit = seqStore->lit + uVar35;
                      if (0xffff < uVar35) {
                        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                        seqStore->longLengthType = ZSTD_llt_literalLength;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                      psVar14 = seqStore->sequences;
                      psVar14->litLength = (U16)uVar35;
                      psVar14->offBase = uVar24 + 3;
                      if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
                      if ((BYTE *)0xffff < unaff_RBP + -3) {
                        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                        seqStore->longLengthType = ZSTD_llt_matchLength;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                      }
                      psVar14->mlBase = (U16)(unaff_RBP + -3);
                      seqStore->sequences = psVar14 + 1;
                      iVar42 = 8;
                      puVar27 = puVar19;
                      local_178 = uVar32;
                      uVar32 = uVar24;
                      goto LAB_0016ef3d;
                    }
                    goto LAB_00171832;
                  }
                  goto LAB_00171813;
                }
                goto LAB_001717d5;
              }
              goto LAB_001717b6;
            }
          }
          uVar18 = pUVar12[uVar35 >> 8];
          bVar49 = (char)uVar35 == (char)uVar18;
          local_174 = pUVar13[uVar47];
          local_c0 = local_c0 + (local_b8 <= puVar19);
          local_b8 = local_b8 + (ulong)(local_b8 <= puVar19) * 0x20;
          puVar21 = (ulong *)((long)puVar19 + local_c0);
          iVar42 = 0xd;
          puVar27 = puVar19;
          if (puVar21 <= puVar33) {
            UVar48 = (int)puVar19 - iVar40;
            iVar42 = 0;
            local_a8 = uVar47;
          }
        }
        else {
          puVar19 = iEnd;
          if (uVar24 < uVar6) {
            puVar19 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar19,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001717b6;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
          puVar27 = (ulong *)((long)puVar27 + 1);
          uVar35 = (long)puVar27 - (long)puVar30;
          puVar19 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar35))
          goto LAB_00171813;
          if (iEnd < puVar27) goto LAB_00171832;
          if (puVar1 < puVar27) {
            ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
          }
          else {
            uVar47 = puVar30[1];
            *puVar19 = *puVar30;
            puVar19[1] = uVar47;
            if (0x10 < uVar35) {
              pBVar44 = seqStore->lit;
              if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
              goto LAB_001718ae;
              uVar47 = puVar30[3];
              *(ulong *)(pBVar44 + 0x10) = *puVar2;
              *(ulong *)(pBVar44 + 0x18) = uVar47;
              if (0x20 < (long)uVar35) {
                lVar25 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                  uVar16 = puVar4[1];
                  pBVar3 = pBVar44 + lVar25 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar16;
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                  uVar16 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                  lVar25 = lVar25 + 0x20;
                } while (pBVar3 + 0x20 < pBVar44 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar20 + 4);
          psVar14 = seqStore->sequences;
          psVar14->litLength = (U16)uVar35;
          psVar14->offBase = 1;
          if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->mlBase = (U16)(sVar20 + 1);
          seqStore->sequences = psVar14 + 1;
          iVar42 = 8;
        }
LAB_0016ef3d:
        puVar19 = puVar21;
      } while (iVar42 == 0);
      if (iVar42 == 8) {
        if (unaff_RBP == (BYTE *)0x0) {
LAB_0017190b:
          __assert_fail("mLength",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7215,
                        "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        puVar30 = (ulong *)((long)puVar27 + (long)unaff_RBP);
        puVar27 = puVar30;
        if (puVar30 <= puVar33) {
          if (pBVar10 + (ulong)UVar48 + 2 <= src) {
LAB_00171949:
            __assert_fail("base+curr+2 > istart",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x721b,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          pUVar13[(ulong)(*(long *)(pBVar10 + (ulong)UVar48 + 2) * -0x30e44323405a9d00) >>
                  (bVar23 & 0x3f)] = UVar48 + 2;
          pUVar13[(ulong)(*(long *)((long)puVar30 + -2) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
               ((int)puVar30 + -2) - iVar40;
          do {
            if (puVar33 < puVar27) break;
            UVar48 = (int)puVar27 - iVar40;
            uVar18 = UVar48 - local_178;
            pBVar44 = pBVar10;
            if (uVar18 < uVar6) {
              pBVar44 = pBVar11 + -(ulong)uVar38;
            }
            if (((uVar6 - 1) - uVar18 < 3) || (*(int *)(pBVar44 + uVar18) != (int)*puVar27)) {
              bVar49 = false;
              uVar18 = local_178;
            }
            else {
              puVar21 = iEnd;
              if (uVar18 < uVar6) {
                puVar21 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar44 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar21,iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001717b6:
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < seqStore->maxNbLit) {
LAB_001717d5:
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              puVar21 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar21) {
LAB_00171813:
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468e,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (iEnd < puVar30) {
LAB_00171832:
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468f,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (puVar1 < puVar30) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar21,(BYTE *)puVar30,(BYTE *)puVar30,(BYTE *)puVar1);
              }
              else {
                uVar35 = puVar30[1];
                *puVar21 = *puVar30;
                puVar21[1] = uVar35;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offBase = 1;
              if (sVar20 + 4 < 3) {
LAB_001717f4:
                __assert_fail("matchLength >= MINMATCH",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46aa,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00171851:
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46ad,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar14 + 1;
              pUVar13[*puVar27 * -0x30e44323405a9d00 >> (bVar23 & 0x3f)] = UVar48;
              puVar30 = (ulong *)(sVar20 + 4 + (long)puVar27);
              bVar49 = true;
              puVar27 = puVar30;
              uVar18 = uVar32;
              uVar32 = local_178;
            }
            local_178 = uVar18;
          } while (bVar49);
        }
        if (puVar27 != puVar30) {
LAB_0017192a:
          __assert_fail("ip0 == anchor",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7236,
                        "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        puVar21 = (ulong *)(uVar26 + (long)puVar27);
        iVar42 = 0;
      }
    } while (iVar42 == 0);
  }
  else {
    if (uVar37 < uVar39) goto LAB_00171987;
    if (uVar6 < uVar31) goto LAB_001719a6;
    if ((ms->prefetchCDictTables != 0) && (uVar18 < 0x3e)) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar22 & 0x3f)));
    }
    if (uVar43 < uVar32) goto LAB_001719c5;
    if (uVar43 < local_178) goto LAB_001719e4;
    puVar27 = (ulong *)((long)src + (ulong)(iVar42 == iVar45));
    bVar23 = 0x20 - cVar17;
    puVar1 = iEnd + -4;
    do {
      if (puVar33 < puVar21) goto LAB_0017178d;
      if ((0x20 < uVar8) || (0x20 < uVar5)) goto LAB_001718cd;
      uVar18 = (int)*puVar27 * -0x61c8864f;
      local_a8 = (ulong)(uVar18 >> (bVar23 & 0x1f));
      uVar18 = uVar18 >> (0x18 - bVar22 & 0x1f);
      local_14c = pUVar12[uVar18 >> 8];
      bVar49 = (char)local_14c == (char)uVar18;
      local_174 = pUVar13[local_a8];
      UVar48 = (int)puVar27 - iVar40;
      local_b0 = puVar27 + 0x20;
      puVar2 = puVar30 + 2;
      puVar19 = puVar21;
      local_b8 = (ulong *)uVar26;
      do {
        uVar18 = (UVar48 - uVar32) + 1;
        piVar34 = (int *)(pBVar10 + uVar18);
        if (uVar18 < uVar6) {
          piVar34 = (int *)(pBVar11 + (uVar18 - uVar38));
        }
        uVar24 = (int)*puVar19 * -0x61c8864f;
        uVar35 = (ulong)(uVar24 >> (bVar23 & 0x1f));
        uVar24 = uVar24 >> (0x18 - bVar22 & 0x1f);
        pUVar13[local_a8] = UVar48;
        puVar21 = puVar19;
        if (((uVar6 - 1) - uVar18 < 3) || (*piVar34 != *(int *)((long)puVar27 + 1))) {
          if (bVar49) {
            uVar18 = local_14c >> 8;
            iVar42 = 0;
            bVar15 = true;
            if (((uVar7 < uVar18) && (*(int *)(pBVar11 + uVar18) == (int)*puVar27)) &&
               (local_174 <= uVar6)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar11 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_RBP = (BYTE *)(sVar20 + 4);
              if (puVar30 < puVar27) {
                pBVar44 = pBVar11 + ((ulong)uVar18 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar27 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar27 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = pBVar46 < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar18 = UVar48 - (uVar18 + uVar38);
              if (uVar18 == 0) goto LAB_001718ec;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              uVar47 = (long)puVar27 - (long)puVar30;
              puVar28 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar28 + uVar47))
              goto LAB_00171813;
              if (iEnd < puVar27) goto LAB_00171832;
              if (puVar1 < puVar27) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar28,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
              }
              else {
                uVar29 = puVar30[1];
                *puVar28 = *puVar30;
                puVar28[1] = uVar29;
                if (0x10 < uVar47) {
                  pBVar44 = seqStore->lit;
                  if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                  goto LAB_001718ae;
                  uVar29 = puVar30[3];
                  *(ulong *)(pBVar44 + 0x10) = *puVar2;
                  *(ulong *)(pBVar44 + 0x18) = uVar29;
                  if (0x20 < (long)uVar47) {
                    lVar25 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                      uVar16 = puVar4[1];
                      pBVar3 = pBVar44 + lVar25 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar16;
                      puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                      uVar16 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                      lVar25 = lVar25 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar44 + uVar47);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar47;
              if (0xffff < uVar47) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar47;
              psVar14->offBase = uVar18 + 3;
              if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
              if ((BYTE *)0xffff < unaff_RBP + -3) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(unaff_RBP + -3);
              seqStore->sequences = psVar14 + 1;
              iVar42 = 8;
              bVar15 = false;
              local_178 = uVar32;
              uVar32 = uVar18;
            }
            if (!bVar15) goto LAB_00171551;
          }
          if (uVar6 < local_174) {
            piVar34 = (int *)(pBVar10 + local_174);
            if (*piVar34 == (int)*puVar27) {
              puVar19 = (ulong *)((long)puVar27 + 4);
              puVar36 = (ulong *)(piVar34 + 1);
              puVar28 = puVar19;
              if (puVar19 < (ulong *)((long)iEnd - 7U)) {
                uVar47 = *puVar19 ^ *puVar36;
                uVar35 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar44 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                if (*puVar36 == *puVar19) {
                  puVar28 = (ulong *)((long)puVar27 + 0xc);
                  puVar36 = (ulong *)(piVar34 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar28) goto LAB_0017130e;
                    uVar35 = *puVar36;
                    uVar47 = *puVar28;
                    uVar41 = uVar47 ^ uVar35;
                    uVar29 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    pBVar44 = (BYTE *)((long)puVar28 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                    puVar28 = puVar28 + 1;
                    puVar36 = puVar36 + 1;
                  } while (uVar35 == uVar47);
                }
              }
              else {
LAB_0017130e:
                if ((puVar28 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar36 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar28 < (ulong *)((long)iEnd + -1)) && ((short)*puVar36 == (short)*puVar28))
                {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar28 < iEnd) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                }
                pBVar44 = (BYTE *)((long)puVar28 - (long)puVar19);
              }
              unaff_RBP = pBVar44 + 4;
              puVar19 = puVar27;
              if (puVar30 < puVar27) {
                pBVar44 = pBVar10 + ((ulong)local_174 - 1);
                do {
                  puVar28 = (ulong *)((long)puVar19 + -1);
                  if ((*(BYTE *)puVar28 != *pBVar44) ||
                     (unaff_RBP = unaff_RBP + 1, puVar19 = puVar28, puVar28 <= puVar30)) break;
                  bVar15 = iStart < pBVar44;
                  pBVar44 = pBVar44 + -1;
                } while (bVar15);
              }
              uVar18 = (int)puVar27 - (int)piVar34;
              if (uVar18 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar35 = (long)puVar19 - (long)puVar30;
                    puVar27 = (ulong *)seqStore->lit;
                    if ((BYTE *)((long)puVar27 + uVar35) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (puVar19 <= iEnd) {
                        if (puVar1 < puVar19) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)puVar27,(BYTE *)puVar30,(BYTE *)puVar19,(BYTE *)puVar1)
                          ;
                        }
                        else {
                          uVar47 = puVar30[1];
                          *puVar27 = *puVar30;
                          puVar27[1] = uVar47;
                          if (0x10 < uVar35) {
                            pBVar44 = seqStore->lit;
                            if (0xffffffffffffffe0 <
                                (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
                            goto LAB_001718ae;
                            uVar47 = puVar30[3];
                            *(ulong *)(pBVar44 + 0x10) = *puVar2;
                            *(ulong *)(pBVar44 + 0x18) = uVar47;
                            if (0x20 < (long)uVar35) {
                              lVar25 = 0;
                              do {
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                                uVar16 = puVar4[1];
                                pBVar3 = pBVar44 + lVar25 + 0x20;
                                *(undefined8 *)pBVar3 = *puVar4;
                                *(undefined8 *)(pBVar3 + 8) = uVar16;
                                puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                                uVar16 = puVar4[1];
                                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                                *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                                lVar25 = lVar25 + 0x20;
                              } while (pBVar3 + 0x20 < pBVar44 + uVar35);
                            }
                          }
                        }
                        seqStore->lit = seqStore->lit + uVar35;
                        if (0xffff < uVar35) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14 = seqStore->sequences;
                        psVar14->litLength = (U16)uVar35;
                        psVar14->offBase = uVar18 + 3;
                        if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
                        if ((BYTE *)0xffff < unaff_RBP + -3) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                          seqStore->longLengthType = ZSTD_llt_matchLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                        }
                        psVar14->mlBase = (U16)(unaff_RBP + -3);
                        seqStore->sequences = psVar14 + 1;
                        iVar42 = 8;
                        puVar27 = puVar19;
                        local_178 = uVar32;
                        uVar32 = uVar18;
                        goto LAB_00171551;
                      }
                      goto LAB_00171832;
                    }
                    goto LAB_00171813;
                  }
                  goto LAB_001717d5;
                }
                goto LAB_001717b6;
              }
              goto LAB_0017188f;
            }
          }
          local_14c = pUVar12[uVar24 >> 8];
          bVar49 = (char)uVar24 == (char)local_14c;
          local_174 = pUVar13[uVar35];
          local_b8 = (ulong *)((long)local_b8 + (ulong)(local_b0 <= puVar19));
          local_b0 = local_b0 + (ulong)(local_b0 <= puVar19) * 0x20;
          puVar21 = (ulong *)((long)puVar19 + (long)local_b8);
          iVar42 = 0xd;
          puVar27 = puVar19;
          if (puVar21 <= puVar33) {
            UVar48 = (int)puVar19 - iVar40;
            iVar42 = 0;
            local_a8 = uVar35;
          }
        }
        else {
          puVar19 = iEnd;
          if (uVar18 < uVar6) {
            puVar19 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar27 + 5),(BYTE *)(piVar34 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar19,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001717b6;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
          puVar27 = (ulong *)((long)puVar27 + 1);
          uVar35 = (long)puVar27 - (long)puVar30;
          puVar19 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar35))
          goto LAB_00171813;
          if (iEnd < puVar27) goto LAB_00171832;
          if (puVar1 < puVar27) {
            ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar30,(BYTE *)puVar27,(BYTE *)puVar1);
          }
          else {
            uVar47 = puVar30[1];
            *puVar19 = *puVar30;
            puVar19[1] = uVar47;
            if (0x10 < uVar35) {
              pBVar44 = seqStore->lit;
              if (0xffffffffffffffe0 < (ulong)((long)(pBVar44 + 0x10) + (-0x10 - (long)puVar2)))
              goto LAB_001718ae;
              uVar47 = puVar30[3];
              *(ulong *)(pBVar44 + 0x10) = *puVar2;
              *(ulong *)(pBVar44 + 0x18) = uVar47;
              if (0x20 < (long)uVar35) {
                lVar25 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x20);
                  uVar16 = puVar4[1];
                  pBVar3 = pBVar44 + lVar25 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar16;
                  puVar4 = (undefined8 *)((long)puVar30 + lVar25 + 0x30);
                  uVar16 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar16;
                  lVar25 = lVar25 + 0x20;
                } while (pBVar3 + 0x20 < pBVar44 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171870;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar20 + 4);
          psVar14 = seqStore->sequences;
          psVar14->litLength = (U16)uVar35;
          psVar14->offBase = 1;
          if (unaff_RBP < (BYTE *)0x3) goto LAB_001717f4;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->mlBase = (U16)(sVar20 + 1);
          seqStore->sequences = psVar14 + 1;
          iVar42 = 8;
        }
LAB_00171551:
        puVar19 = puVar21;
      } while (iVar42 == 0);
      if (iVar42 == 8) {
        if (unaff_RBP == (BYTE *)0x0) goto LAB_0017190b;
        puVar30 = (ulong *)((long)puVar27 + (long)unaff_RBP);
        puVar27 = puVar30;
        if (puVar30 <= puVar33) {
          if (pBVar10 + (ulong)UVar48 + 2 <= src) goto LAB_00171949;
          pUVar13[(uint)(*(int *)(pBVar10 + (ulong)UVar48 + 2) * -0x61c8864f) >> (bVar23 & 0x1f)] =
               UVar48 + 2;
          pUVar13[(uint)(*(int *)((long)puVar30 + -2) * -0x61c8864f) >> (bVar23 & 0x1f)] =
               ((int)puVar30 + -2) - iVar40;
          do {
            if (puVar33 < puVar27) break;
            UVar48 = (int)puVar27 - iVar40;
            uVar18 = UVar48 - local_178;
            pBVar44 = pBVar10;
            if (uVar18 < uVar6) {
              pBVar44 = pBVar11 + -(ulong)uVar38;
            }
            if (((uVar6 - 1) - uVar18 < 3) || (*(int *)(pBVar44 + uVar18) != (int)*puVar27)) {
              bVar49 = false;
              uVar18 = local_178;
            }
            else {
              puVar21 = iEnd;
              if (uVar18 < uVar6) {
                puVar21 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar27 + 4),(BYTE *)((long)(pBVar44 + uVar18) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar21,iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001717b6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001717d5;
              puVar21 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar21) goto LAB_00171813;
              if (iEnd < puVar30) goto LAB_00171832;
              if (puVar1 < puVar30) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar21,(BYTE *)puVar30,(BYTE *)puVar30,(BYTE *)puVar1);
              }
              else {
                uVar35 = puVar30[1];
                *puVar21 = *puVar30;
                puVar21[1] = uVar35;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_001717f4;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00171851;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar14 + 1;
              pUVar13[(uint)((int)*puVar27 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar48;
              puVar30 = (ulong *)(sVar20 + 4 + (long)puVar27);
              bVar49 = true;
              puVar27 = puVar30;
              uVar18 = uVar32;
              uVar32 = local_178;
            }
            local_178 = uVar18;
          } while (bVar49);
        }
        if (puVar27 != puVar30) goto LAB_0017192a;
        puVar21 = (ulong *)(uVar26 + (long)puVar27);
        iVar42 = 0;
      }
    } while (iVar42 == 0);
  }
  if (iVar42 == 0xd) {
LAB_0017178d:
    *rep = uVar32;
    rep[1] = local_178;
    iEnd = (ulong *)((long)iEnd - (long)puVar30);
  }
  return (size_t)iEnd;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}